

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

string * bloaty::anon_unknown_35::FixedWidthString
                   (string *__return_storage_ptr__,string *input,size_t size)

{
  ulong uVar1;
  pointer pcVar2;
  string *extraout_RAX;
  string *psVar3;
  string *ret;
  
  uVar1 = input->_M_string_length;
  if (uVar1 < size) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (input->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar1);
    psVar3 = extraout_RAX;
    while (__return_storage_ptr__->_M_string_length < size) {
      psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    return psVar3;
  }
  psVar3 = (string *)std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)input);
  return psVar3;
}

Assistant:

std::string FixedWidthString(const std::string& input, size_t size) {
  if (input.size() < size) {
    std::string ret = input;
    while (ret.size() < size) {
      ret += " ";
    }
    return ret;
  } else {
    return input.substr(0, size);
  }
}